

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 get_program(int argc,char **argv)

{
  fstream *this;
  undefined8 *in_RDX;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
  _Var1;
  char *program_name;
  long *local_38 [2];
  long local_28 [2];
  
  _Var1.
  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl.
  _4_4_ = in_register_0000003c;
  _Var1.
  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl.
  _0_4_ = argc;
  if ((int)argv < 3) {
    if ((int)argv == 2) {
      this = (fstream *)operator_new(0x210);
      std::fstream::fstream(this,(char *)in_RDX[1],_S_in);
    }
    else {
      this = (fstream *)operator_new(0x188);
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_38,
                 "\n(/fix./z.\n  (/fib.fib z)\n  (fix (/f./x.x))\n)\n(/f.(/x.f (/z.x x z)) (/x.f (/z.x x z)))\nz\n"
                 ,"");
      std::__cxx11::stringstream::stringstream((stringstream *)this,(string *)local_38,_S_out|_S_in)
      ;
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
    }
    *(fstream **)
     _Var1.
     super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
     .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = this;
    return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
            )(tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
              )_Var1.
               super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl;
  }
  local_38[0] = (long *)*in_RDX;
  ublib::failwith<void,char[8],char_const*,char[20]>
            ((char (*) [8])"Usage: ",(char **)local_38,(char (*) [20])" [filename=code.lc]");
}

Assistant:

std::unique_ptr<std::istream> get_program(int argc, char const* const* argv) {
  if (argc > 2) {
    auto const program_name = (argc > 0) ? argv[0] : "[program]";
    ublib::failwith("Usage: ", program_name, " [filename=code.lc]");
  } else if (argc == 2) {
    return std::make_unique<std::fstream>(argv[1], std::ios_base::in);
  } else {
    return std::make_unique<std::stringstream>(default_program);
  }
}